

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall
doctest::detail::stringifyBinaryExpr<std::__cxx11::string,char[4]>
          (String *__return_storage_ptr__,detail *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,char *op,
          char (*rhs) [4])

{
  String local_98;
  String local_70;
  String local_58;
  String local_40;
  char (*local_28) [4];
  char (*rhs_local) [4];
  char *op_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs_local;
  
  local_28 = (char (*) [4])op;
  rhs_local = (char (*) [4])lhs;
  op_local = (char *)this;
  lhs_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __return_storage_ptr__;
  toString<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  String::String(&local_70,*rhs_local);
  doctest::operator+(&local_40,&local_58,&local_70);
  toString<char[4],_true>(&local_98,local_28);
  doctest::operator+(__return_storage_ptr__,&local_40,&local_98);
  String::~String(&local_98);
  String::~String(&local_40);
  String::~String(&local_70);
  String::~String(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }